

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplified-instance-converter.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *fh;
  FILE *unaff_RBX;
  Instance *pIVar1;
  Instance instance;
  Instance local_60;
  
  if (argc == 3) {
    unaff_RBX = (FILE *)argv[2];
    parse(&local_60,argv[1]);
    if ((((0 < local_60.num_customers) && (0 < local_60.num_vehicles)) &&
        (0.0 < local_60.vehicle_cap)) && (local_60.demands != (double *)0x0)) {
      fh = fopen((char *)unaff_RBX,"w");
      if (fh != (FILE *)0x0) {
        render_instance_into_vrplib_file((FILE *)fh,&local_60,true);
        instance_destroy(&local_60);
        return 0;
      }
      goto LAB_0010273b;
    }
  }
  else {
    print_usage(_stderr,*argv);
  }
  main_cold_1();
LAB_0010273b:
  pIVar1 = &local_60;
  main_cold_2();
  fprintf(unaff_RBX,"%s [INPUT-TEST-INSTANCE] [OUTPUT-TEST-INSTANCE]\n",pIVar1);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 3) {
        print_usage(stderr, argv[0]);
        exit(EXIT_FAILURE);
    }

    char *input = argv[1];
    char *output = argv[2];

    Instance instance = parse(input);
    if (!is_valid_instance(&instance)) {
        fprintf(stderr, "%s: failed to parse\n", input);
        exit(EXIT_FAILURE);
    }

    FILE *fh = fopen(output, "w");
    if (!fh) {
        fprintf(stderr, "%s: failed to open file for writing\n", output);
        instance_destroy(&instance);
        exit(EXIT_FAILURE);
    }

    render_instance_into_vrplib_file(fh, &instance, true);
    instance_destroy(&instance);
    return EXIT_SUCCESS;
}